

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

int32_t utf8TextMapIndexToUTF16(UText *ut,int64_t index64)

{
  void *pvVar1;
  int32_t offset;
  int32_t mapIndex;
  UTF8Buf *u8b;
  int32_t index;
  int64_t index64_local;
  UText *ut_local;
  
  pvVar1 = ut->p;
  return (uint)*(byte *)((long)pvVar1 + (long)((int)index64 - *(int *)((long)pvVar1 + 0x14)) + 0x84)
         - *(int *)((long)pvVar1 + 8);
}

Assistant:

static int32_t U_CALLCONV
utf8TextMapIndexToUTF16(const UText *ut, int64_t index64) {
    U_ASSERT(index64 <= 0x7fffffff);
    int32_t index = (int32_t)index64;
    UTF8Buf *u8b = (UTF8Buf *)ut->p;
    U_ASSERT(index>=ut->chunkNativeStart+ut->nativeIndexingLimit);
    U_ASSERT(index<=ut->chunkNativeLimit);
    int32_t mapIndex = index - u8b->toUCharsMapStart;
    U_ASSERT(mapIndex < (int32_t)sizeof(UTF8Buf::mapToUChars));
    int32_t offset = u8b->mapToUChars[mapIndex] - u8b->bufStartIdx;
    U_ASSERT(offset>=0 && offset<=ut->chunkLength);
    return offset;
}